

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtGStateRegistry.cpp
# Opt level: O1

ObjectIDTypeAndBool __thiscall
ExtGStateRegistry::RegisterExtGStateForOpacity(ExtGStateRegistry *this,double inAlphaValue)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  IndirectObjectsReferenceRegistry *this_00;
  _Rb_tree_iterator<std::pair<const_double,_unsigned_long>_> _Var5;
  _Base_ptr p_Var6;
  undefined8 uVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_bool> pVar8;
  ObjectIDTypeAndBool OVar9;
  pair<const_double,_unsigned_long> local_18;
  
  if (this->mObjectsContext == (ObjectsContext *)0x0) {
    p_Var4 = (_Base_ptr)0x0;
    uVar7 = 0;
  }
  else {
    p_Var1 = &(this->mAlphaExtGstates)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = (this->mAlphaExtGstates)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[bVar3 && bVar2]) {
      bVar2 = inAlphaValue != *(double *)(p_Var4 + 1);
      bVar3 = *(double *)(p_Var4 + 1) <= inAlphaValue;
      if (!bVar3 || !bVar2) {
        p_Var6 = p_Var4;
      }
    }
    _Var5._M_node = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (*(double *)(p_Var6 + 1) <= inAlphaValue)) {
      _Var5._M_node = p_Var6;
    }
    if ((_Rb_tree_header *)_Var5._M_node == p_Var1) {
      this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
      local_18.second = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
      local_18.first = inAlphaValue;
      pVar8 = std::
              _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
              ::_M_insert_unique<std::pair<double_const,unsigned_long>>
                        ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                          *)&this->mAlphaExtGstates,&local_18);
      _Var5 = pVar8.first._M_node;
      uVar7 = CONCAT71(pVar8._9_7_,1);
    }
    else {
      uVar7 = 0;
    }
    p_Var4 = _Var5._M_node[1]._M_parent;
  }
  OVar9._8_8_ = uVar7;
  OVar9.first = (unsigned_long)p_Var4;
  return OVar9;
}

Assistant:

ObjectIDTypeAndBool ExtGStateRegistry::RegisterExtGStateForOpacity(double inAlphaValue) {
    if(!mObjectsContext)
        return ObjectIDTypeAndBool(0,false);

    DoubleToObjectIDTypeMap::iterator it = mAlphaExtGstates.find(inAlphaValue);

    if(it == mAlphaExtGstates.end()) {
        ObjectIDType objectId = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
        it = mAlphaExtGstates.insert(DoubleToObjectIDTypeMap::value_type(inAlphaValue,objectId)).first;
        return ObjectIDTypeAndBool(it->second,true);
    }

    return ObjectIDTypeAndBool(it->second, false);
}